

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

bool __thiscall QRegion::intersects(QRegion *this,QRegion *region)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  QRegionPrivate *pQVar7;
  QRegionPrivate *pQVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  QRect *myRect;
  QRect *pQVar13;
  QRect *pQVar14;
  QRect *pQVar15;
  long lVar16;
  
  if (this->d != &shared_empty) {
    pQVar7 = this->d->qt_rgn;
    iVar1 = pQVar7->numRects;
    if (((long)iVar1 != 0) && (region->d != &shared_empty)) {
      pQVar8 = region->d->qt_rgn;
      iVar2 = pQVar8->numRects;
      if ((long)iVar2 != 0) {
        uVar3 = (pQVar7->extents).x2;
        uVar9 = (pQVar7->extents).y2;
        uVar4 = (pQVar8->extents).x1;
        uVar10 = (pQVar8->extents).y1;
        if ((int)uVar4 <= (int)uVar3) {
          uVar5 = (pQVar7->extents).x1;
          uVar11 = (pQVar7->extents).y1;
          uVar6 = (pQVar8->extents).x2;
          uVar12 = (pQVar8->extents).y2;
          if ((((int)uVar5 <= (int)uVar6) && ((int)uVar10 <= (int)uVar9)) &&
             ((int)uVar11 <= (int)uVar12)) {
            if ((iVar1 == 1) && (iVar2 == 1)) {
              return true;
            }
            if (iVar1 == 1) {
              pQVar13 = &pQVar7->extents;
            }
            else {
              pQVar13 = (pQVar7->rects).d.ptr;
            }
            if (iVar2 == 1) {
              pQVar15 = &pQVar8->extents;
            }
            else {
              pQVar15 = (pQVar8->rects).d.ptr;
            }
            pQVar14 = pQVar13 + iVar1;
            do {
              lVar16 = 0;
              do {
                if (((*(int *)((long)&(pQVar15->x1).m_i + lVar16) <= (pQVar13->x2).m_i) &&
                    ((pQVar13->x1).m_i <= *(int *)((long)&(pQVar15->x2).m_i + lVar16))) &&
                   ((*(int *)((long)&(pQVar15->y1).m_i + lVar16) <= (pQVar13->y2).m_i &&
                    ((pQVar13->y1).m_i <= *(int *)((long)&(pQVar15->y2).m_i + lVar16))))) {
                  return true;
                }
                lVar16 = lVar16 + 0x10;
              } while ((long)iVar2 * 0x10 != lVar16);
              pQVar13 = pQVar13 + 1;
            } while (pQVar13 != pQVar14);
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool QRegion::isEmpty() const
{
    return d == &shared_empty || d->qt_rgn->numRects == 0;
}